

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
       *this,void *p,size_t size,utf32_t replacementChar)

{
  StringRef_utf32 *pattern;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_RSI;
  BoyerMooreTextState *in_RDI;
  BoyerMooreTextState state;
  utf32_t in_stack_000003e4;
  size_t in_stack_000003e8;
  void *in_stack_000003f0;
  BoyerMooreTextState *in_stack_000003f8;
  BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *in_stack_00000400;
  undefined1 in_stack_ffffffffffffff0f;
  BoyerMooreTextState *p_00;
  BoyerMooreTextState *this_00;
  BoyerMooreTextState local_b8;
  
  p_00 = in_RDI;
  pattern = (StringRef_utf32 *)sl::Array::operator_cast_to_wchar_t_((Array *)in_RSI);
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::getCount
            ((ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)in_RSI);
  this_00 = &local_b8;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::StringRefBase
            (in_RSI,(C *)p_00,(size_t)in_RDI,(bool)in_stack_ffffffffffffff0f);
  BoyerMooreTextState::BoyerMooreTextState(this_00,pattern);
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::~StringRefBase
            ((StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *)0x122966);
  find(in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,in_stack_000003e4);
  BoyerMooreTextState::~BoyerMooreTextState(in_RDI);
  return (BoyerMooreTextFindResult *)p_00;
}

Assistant:

BoyerMooreTextFindResult
	find(
		const void* p,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		BoyerMooreTextState state(sl::StringRef_utf32(this->m_pattern, this->m_pattern.getCount()));
		BoyerMooreTextFindResult result = find(&state, p, size, replacementChar);
		if (IsWholeWord && !result.isValid())
			result = eof(&state);
		return result;
	}